

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

void __thiscall QHexView::moveNext(QHexView *this,bool select)

{
  longlong lVar1;
  Mode MVar2;
  QHexCursor *pQVar3;
  qint64 qVar4;
  longlong *plVar5;
  qint64 qVar6;
  fd_set *__writefds;
  fd_set *in_R8;
  timeval *in_R9;
  long local_50;
  quint64 local_48;
  long local_40;
  quint64 local_38;
  long local_30;
  qint64 offset;
  qint64 column;
  qint64 line;
  QHexView *pQStack_10;
  bool select_local;
  QHexView *this_local;
  
  line._7_1_ = select;
  pQStack_10 = this;
  pQVar3 = hexCursor(this);
  column = QHexCursor::line(pQVar3);
  pQVar3 = hexCursor(this);
  qVar4 = QHexCursor::column(pQVar3);
  if (qVar4 < (long)(ulong)((this->m_options).linelength - 1)) {
    offset = qVar4 + 1;
  }
  else {
    column = column + 1;
    offset = 0;
  }
  pQVar3 = hexCursor(this);
  MVar2 = QHexCursor::mode(pQVar3);
  __writefds = (fd_set *)0x1;
  local_30 = (long)(int)(uint)(MVar2 == Insert);
  if ((line._7_1_ & 1) == 0) {
    pQVar3 = hexCursor(this);
    local_48 = lines(this);
    plVar5 = qMin<long_long>(&column,(longlong *)&local_48);
    qVar4 = *plVar5;
    qVar6 = getLastColumn(this,column);
    local_50 = qVar6 + local_30;
    plVar5 = qMin<long_long>(&offset,&local_50);
    QHexCursor::move(pQVar3,qVar4,*plVar5);
  }
  else {
    pQVar3 = hexCursor(this);
    local_38 = lines(this);
    plVar5 = qMin<long_long>(&column,(longlong *)&local_38);
    lVar1 = *plVar5;
    qVar4 = getLastColumn(this,column);
    local_40 = qVar4 + local_30;
    plVar5 = qMin<long_long>(&offset,&local_40);
    QHexCursor::select(pQVar3,(int)lVar1,(fd_set *)*plVar5,__writefds,in_R8,in_R9);
  }
  return;
}

Assistant:

void QHexView::moveNext(bool select) {
    auto line = this->hexCursor()->line(), column = this->hexCursor()->column();

    if(column >= m_options.linelength - 1) {
        line++;
        column = 0;
    }
    else
        column++;

    qint64 offset =
        this->hexCursor()->mode() == QHexCursor::Mode::Insert ? 1 : 0;
    if(select)
        this->hexCursor()->select(
            qMin<qint64>(line, this->lines()),
            qMin<qint64>(column, this->getLastColumn(line) + offset));
    else
        this->hexCursor()->move(
            qMin<qint64>(line, this->lines()),
            qMin<qint64>(column, this->getLastColumn(line) + offset));
}